

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O2

void ecs_set_target_fps(ecs_world_t *world,float fps)

{
  _Bool _Var1;
  
  _ecs_assert(world->magic == 0x65637377,0x1a,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,700);
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == (0x65637377)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,700,"void ecs_set_target_fps(ecs_world_t *, float)");
  }
  _Var1 = ecs_os_has_time();
  _ecs_assert(_Var1,0x20,(char *)0x0,"ecs_os_has_time()",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x2bd);
  _Var1 = ecs_os_has_time();
  if (_Var1) {
    if (world->arg_fps != 0) {
      return;
    }
    ecs_measure_frame_time(world,true);
    (world->stats).target_fps = fps;
    ecs_increase_timer_resolution(60.0 <= fps);
    return;
  }
  __assert_fail("ecs_os_has_time()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x2bd,"void ecs_set_target_fps(ecs_world_t *, float)");
}

Assistant:

void ecs_set_target_fps(
    ecs_world_t *world,
    FLECS_FLOAT fps)
{
    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INVALID_FROM_WORKER, NULL);
    ecs_assert(ecs_os_has_time(), ECS_MISSING_OS_API, NULL);

    if (!world->arg_fps) {
        ecs_measure_frame_time(world, true);
        world->stats.target_fps = fps;
        set_timer_resolution(fps);
    }
}